

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
bsim::quad_value_bit_vector::hex_string_abi_cxx11_(quad_value_bit_vector *this)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  iterator __last;
  vector<bsim::quad_value,_std::allocator<bsim::quad_value>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int index;
  int j;
  bool found_abnormal;
  uchar bit_l;
  int i;
  string hex_digits;
  string hex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  quad_value *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 in_stack_ffffffffffffff58;
  int local_90;
  byte local_89;
  int local_88;
  allocator local_81;
  string local_80 [48];
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  std::operator+(in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10);
  std::__cxx11::string::~string(local_50);
  __rhs = &local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",__rhs);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_88 = 0;
  do {
    sVar4 = std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::size(in_RSI);
    if ((int)sVar4 <= local_88) {
      __last = std::begin<std::__cxx11::string>(in_stack_ffffffffffffff08);
      std::end<std::__cxx11::string>(in_stack_ffffffffffffff08);
      __first._M_current._4_2_ = in_stack_ffffffffffffff24;
      __first._M_current._0_4_ = in_stack_ffffffffffffff20;
      __first._M_current._6_1_ = in_stack_ffffffffffffff26;
      __first._M_current._7_1_ = in_stack_ffffffffffffff27;
      std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )__last._M_current);
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_30);
      return in_RDI;
    }
    local_89 = 0;
    bVar2 = false;
    for (local_90 = 0; local_90 < 4; local_90 = local_90 + 1) {
      iVar3 = local_88 + local_90;
      sVar4 = std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::size(in_RSI);
      if (iVar3 < (int)sVar4) {
        pvVar5 = std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::operator[]
                           (in_RSI,(long)iVar3);
        in_stack_ffffffffffffff27 = quad_value::is_binary(pvVar5);
        if (!(bool)in_stack_ffffffffffffff27) {
          pvVar5 = std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::operator[]
                             (in_RSI,(long)iVar3);
          in_stack_ffffffffffffff26 = quad_value::is_unknown(pvVar5);
          if ((bool)in_stack_ffffffffffffff26) {
            local_89 = 0x78;
            bVar2 = true;
          }
          else {
            pvVar5 = std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::operator[]
                               (in_RSI,(long)iVar3);
            bVar2 = quad_value::is_high_impedance(pvVar5);
            if (!bVar2) {
              __assert_fail("bits[index].is_high_impedance()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                            ,0x1b9,"std::string bsim::quad_value_bit_vector::hex_string() const");
            }
            local_89 = 0x7a;
            bVar2 = true;
          }
          break;
        }
        std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::operator[]
                  (in_RSI,(long)iVar3);
        bVar1 = quad_value::binary_value(in_stack_ffffffffffffff10);
        local_89 = local_89 | (byte)((bVar1 & 1) << ((byte)local_90 & 0x1f));
      }
    }
    if (bVar2) {
      std::__cxx11::string::operator+=(local_80,local_89);
    }
    else {
      if (local_89 < 10) {
        in_stack_ffffffffffffff20 = local_89 + 0x30;
      }
      else {
        in_stack_ffffffffffffff20 = local_89 + 0x57;
      }
      std::__cxx11::string::operator+=(local_80,(char)in_stack_ffffffffffffff20);
    }
    local_88 = local_88 + 4;
  } while( true );
}

Assistant:

std::string hex_string() const {
      std::string hex = std::to_string(N) + "'h";

      std::string hex_digits = "";

      for (int i = 0; i < ((int) bits.size()); i += 4) {
        unsigned char bit_l = 0;
        bool found_abnormal = false;

        for (int j = 0; j < 4; j++) {
          int index = i + j;
          if (index >= ((int) bits.size())) {
          } else {
            if (bits[index].is_binary()) {
              bit_l |= (bits[index].binary_value() & 0x01) << j;
            } else if (bits[index].is_unknown()) {
              bit_l = 'x';
              found_abnormal = true;
              break;
            } else {
              assert(bits[index].is_high_impedance());
              bit_l = 'z';
              found_abnormal = true;
              break;
            }
          }
        }

        if (!found_abnormal) {
          hex_digits += bit_l > 9 ? bit_l + 87 : bit_l + 48;
        } else {
          hex_digits += bit_l;
        }

      }

      std::reverse(std::begin(hex_digits), std::end(hex_digits));
      return hex + hex_digits;
    }